

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineOption.cpp
# Opt level: O2

string * __thiscall
senjo::EngineOption::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,EngineOption *this,OptionType type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar2 = "button";
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = "check";
    paVar1 = &local_a;
    break;
  case 3:
    pcVar2 = "combo";
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = "spin";
    paVar1 = &local_c;
    break;
  case 5:
    pcVar2 = "string";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "unknown";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string EngineOption::GetTypeName(const EngineOption::OptionType type)
{
  switch (type) {
  case OptionType::Button:   return OPT_BUTTON_NAME;
  case OptionType::Checkbox: return OPT_CHECK_NAME;
  case OptionType::ComboBox: return OPT_COMBO_NAME;
  case OptionType::Spin:     return OPT_SPIN_NAME;
  case OptionType::String:   return OPT_STRING_NAME;
  default:
    break;
  }
  return OPT_UNKNOWN_NAME;
}